

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_classifier.cpp
# Opt level: O3

istream * operator>>(istream *s,Am_Gesture_Classifier *cl)

{
  uint *puVar1;
  Gesture_Class *pGVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char cVar25;
  undefined1 auVar26 [16];
  Am_Gesture_Classifier *pAVar27;
  int iVar28;
  long *plVar29;
  Am_Gesture_Classifier_Data *pAVar30;
  istream *piVar31;
  Vector pdVar32;
  Matrix ppdVar33;
  double *pdVar34;
  Gesture_Class *this;
  Vector *ppdVar35;
  long lVar36;
  long lVar37;
  bool *pbVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar49;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long lVar48;
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar70;
  undefined1 auVar68 [16];
  int iVar71;
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  int iVar89;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  char check;
  int n;
  char buf [100];
  char local_bd;
  int local_bc;
  Am_Gesture_Classifier_Data *local_b8;
  Am_Gesture_Classifier *local_b0;
  undefined1 local_a8 [16];
  long local_98;
  char local_90;
  long lVar51;
  
  local_b0 = cl;
  std::istream::get((char *)s,(long)&local_98,'d');
  plVar29 = (long *)std::istream::get((char *)s);
  if (((*(byte *)((long)plVar29 + *(long *)(*plVar29 + -0x18) + 0x20) & 5) == 0) &&
     (local_bd == '\n')) {
    lVar37 = 0;
    do {
      iVar28 = strcmp((char *)&local_98,*(char **)((long)version_messages + lVar37));
      if (iVar28 == 0) {
        std::istream::operator>>((istream *)s,&local_bc);
        std::istream::get((char *)s,(long)&local_98,'d');
        plVar29 = (long *)std::istream::get((char *)s);
        if ((((*(byte *)((long)plVar29 + *(long *)(*plVar29 + -0x18) + 0x20) & 5) == 0) &&
            (local_bd == '\n')) && (local_90 == '\0' && local_98 == 0x73657373616c6320)) {
          pAVar30 = (Am_Gesture_Classifier_Data *)operator_new(0x28);
          Am_Gesture_Classifier_Data::Am_Gesture_Classifier_Data(pAVar30,local_bc);
          pGVar2 = pAVar30->classes;
          cVar25 = (char)s;
          local_b8 = pAVar30;
          if (local_bc < 1) goto LAB_001a33f9;
          lVar36 = 0;
          this = pGVar2;
          goto LAB_001a338c;
        }
        break;
      }
      lVar37 = lVar37 + 8;
    } while (lVar37 != 0x10);
  }
  goto LAB_001a3ad3;
  while( true ) {
    Am_String::operator=(&this->name,(char *)&local_98);
    lVar36 = lVar36 + 1;
    this = this + 1;
    if (local_bc <= lVar36) break;
LAB_001a338c:
    std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar25);
    std::istream::get((char *)s,(long)&local_98,'d');
    plVar29 = (long *)std::istream::get((char *)s);
    if (((*(byte *)((long)plVar29 + *(long *)(*plVar29 + -0x18) + 0x20) & 5) != 0) ||
       (local_bd != '\n')) goto LAB_001a3ad3;
  }
LAB_001a33f9:
  piVar31 = std::operator>>(s,&local_bd);
  if (local_bd == 'V' && ((byte)piVar31[*(long *)(*(long *)piVar31 + -0x18) + 0x20] & 5) == 0) {
    std::istream::putback(cVar25);
    if (0 < local_bc) {
      ppdVar35 = &pGVar2->w;
      lVar36 = 0;
      do {
        pdVar32 = InputVector(s);
        ppdVar35[-1] = pdVar32;
        pdVar32 = InputVector(s);
        *ppdVar35 = pdVar32;
        lVar36 = lVar36 + 1;
        ppdVar35 = ppdVar35 + 6;
      } while (lVar36 < local_bc);
    }
    pdVar32 = InputVector(s);
    if (0 < (long)local_bc) {
      pdVar34 = &pGVar2->cnst;
      lVar36 = 0;
      do {
        *pdVar34 = pdVar32[lVar36];
        lVar36 = lVar36 + 1;
        pdVar34 = pdVar34 + 6;
      } while (local_bc != lVar36);
    }
    FreeVector(pdVar32);
    auVar26 = _DAT_00284090;
    if (lVar37 == 0) {
      if (0 < (long)local_bc) {
        lVar37 = (long)local_bc + -1;
        local_a8._8_4_ = (int)lVar37;
        local_a8._0_8_ = lVar37;
        local_a8._12_4_ = (int)((ulong)lVar37 >> 0x20);
        lVar37 = 0;
        auVar39 = local_a8;
        auVar50 = _DAT_002849a0;
        auVar52 = _DAT_002849b0;
        auVar53 = _DAT_002849c0;
        auVar54 = _DAT_002849d0;
        auVar55 = _DAT_002849e0;
        auVar56 = _DAT_002849f0;
        auVar57 = _DAT_00284a00;
        auVar58 = _DAT_00284a10;
        do {
          auVar68 = local_a8 ^ auVar26;
          auVar72 = auVar58 ^ auVar26;
          iVar28 = auVar68._0_4_;
          iVar85 = -(uint)(iVar28 < auVar72._0_4_);
          iVar49 = auVar68._4_4_;
          auVar74._4_4_ = -(uint)(iVar49 < auVar72._4_4_);
          iVar70 = auVar68._8_4_;
          iVar89 = -(uint)(iVar70 < auVar72._8_4_);
          iVar71 = auVar68._12_4_;
          auVar74._12_4_ = -(uint)(iVar71 < auVar72._12_4_);
          auVar68._4_4_ = iVar85;
          auVar68._0_4_ = iVar85;
          auVar68._8_4_ = iVar89;
          auVar68._12_4_ = iVar89;
          auVar68 = pshuflw(auVar39,auVar68,0xe8);
          auVar73._4_4_ = -(uint)(auVar72._4_4_ == iVar49);
          auVar73._12_4_ = -(uint)(auVar72._12_4_ == iVar71);
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar59 = pshuflw(in_XMM11,auVar73,0xe8);
          auVar74._0_4_ = auVar74._4_4_;
          auVar74._8_4_ = auVar74._12_4_;
          auVar72 = pshuflw(auVar68,auVar74,0xe8);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar39 = (auVar72 | auVar59 & auVar68) ^ auVar39;
          auVar39 = packssdw(auVar39,auVar39);
          if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (&pGVar2->is_dot)[lVar37] = false;
          }
          auVar59._4_4_ = iVar85;
          auVar59._0_4_ = iVar85;
          auVar59._8_4_ = iVar89;
          auVar59._12_4_ = iVar89;
          auVar74 = auVar73 & auVar59 | auVar74;
          auVar39 = packssdw(auVar74,auVar74);
          auVar72._8_4_ = 0xffffffff;
          auVar72._0_8_ = 0xffffffffffffffff;
          auVar72._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 ^ auVar72,auVar39 ^ auVar72);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39._0_4_ >> 8 & 1) != 0) {
            (&pGVar2[1].is_dot)[lVar37] = false;
          }
          auVar39 = auVar57 ^ auVar26;
          auVar60._0_4_ = -(uint)(iVar28 < auVar39._0_4_);
          auVar60._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
          auVar60._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
          auVar60._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
          auVar75._4_4_ = auVar60._0_4_;
          auVar75._0_4_ = auVar60._0_4_;
          auVar75._8_4_ = auVar60._8_4_;
          auVar75._12_4_ = auVar60._8_4_;
          iVar85 = -(uint)(auVar39._4_4_ == iVar49);
          iVar89 = -(uint)(auVar39._12_4_ == iVar71);
          auVar12._4_4_ = iVar85;
          auVar12._0_4_ = iVar85;
          auVar12._8_4_ = iVar89;
          auVar12._12_4_ = iVar89;
          auVar86._4_4_ = auVar60._4_4_;
          auVar86._0_4_ = auVar60._4_4_;
          auVar86._8_4_ = auVar60._12_4_;
          auVar86._12_4_ = auVar60._12_4_;
          auVar39 = auVar12 & auVar75 | auVar86;
          auVar39 = packssdw(auVar39,auVar39);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 ^ auVar3,auVar39 ^ auVar3);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
            (&pGVar2[2].is_dot)[lVar37] = false;
          }
          auVar39 = pshufhw(auVar39,auVar75,0x84);
          auVar13._4_4_ = iVar85;
          auVar13._0_4_ = iVar85;
          auVar13._8_4_ = iVar89;
          auVar13._12_4_ = iVar89;
          auVar72 = pshufhw(auVar60,auVar13,0x84);
          auVar68 = pshufhw(auVar39,auVar86,0x84);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar40 = (auVar68 | auVar72 & auVar39) ^ auVar40;
          auVar39 = packssdw(auVar40,auVar40);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39._0_4_ >> 0x18 & 1) != 0) {
            (&pGVar2[3].is_dot)[lVar37] = false;
          }
          auVar39 = auVar56 ^ auVar26;
          auVar61._0_4_ = -(uint)(iVar28 < auVar39._0_4_);
          auVar61._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
          auVar61._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
          auVar61._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
          auVar14._4_4_ = auVar61._0_4_;
          auVar14._0_4_ = auVar61._0_4_;
          auVar14._8_4_ = auVar61._8_4_;
          auVar14._12_4_ = auVar61._8_4_;
          auVar72 = pshuflw(auVar86,auVar14,0xe8);
          auVar41._0_4_ = -(uint)(auVar39._0_4_ == iVar28);
          auVar41._4_4_ = -(uint)(auVar39._4_4_ == iVar49);
          auVar41._8_4_ = -(uint)(auVar39._8_4_ == iVar70);
          auVar41._12_4_ = -(uint)(auVar39._12_4_ == iVar71);
          auVar76._4_4_ = auVar41._4_4_;
          auVar76._0_4_ = auVar41._4_4_;
          auVar76._8_4_ = auVar41._12_4_;
          auVar76._12_4_ = auVar41._12_4_;
          auVar39 = pshuflw(auVar41,auVar76,0xe8);
          auVar77._4_4_ = auVar61._4_4_;
          auVar77._0_4_ = auVar61._4_4_;
          auVar77._8_4_ = auVar61._12_4_;
          auVar77._12_4_ = auVar61._12_4_;
          auVar68 = pshuflw(auVar61,auVar77,0xe8);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 & auVar72,(auVar68 | auVar39 & auVar72) ^ auVar4);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            (&pGVar2[4].is_dot)[lVar37] = false;
          }
          auVar15._4_4_ = auVar61._0_4_;
          auVar15._0_4_ = auVar61._0_4_;
          auVar15._8_4_ = auVar61._8_4_;
          auVar15._12_4_ = auVar61._8_4_;
          auVar77 = auVar76 & auVar15 | auVar77;
          auVar68 = packssdw(auVar77,auVar77);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39,auVar68 ^ auVar5);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39._4_2_ >> 8 & 1) != 0) {
            (&pGVar2[5].is_dot)[lVar37] = false;
          }
          auVar39 = auVar55 ^ auVar26;
          auVar62._0_4_ = -(uint)(iVar28 < auVar39._0_4_);
          auVar62._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
          auVar62._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
          auVar62._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
          auVar78._4_4_ = auVar62._0_4_;
          auVar78._0_4_ = auVar62._0_4_;
          auVar78._8_4_ = auVar62._8_4_;
          auVar78._12_4_ = auVar62._8_4_;
          iVar85 = -(uint)(auVar39._4_4_ == iVar49);
          iVar89 = -(uint)(auVar39._12_4_ == iVar71);
          auVar16._4_4_ = iVar85;
          auVar16._0_4_ = iVar85;
          auVar16._8_4_ = iVar89;
          auVar16._12_4_ = iVar89;
          auVar87._4_4_ = auVar62._4_4_;
          auVar87._0_4_ = auVar62._4_4_;
          auVar87._8_4_ = auVar62._12_4_;
          auVar87._12_4_ = auVar62._12_4_;
          auVar39 = auVar16 & auVar78 | auVar87;
          auVar39 = packssdw(auVar39,auVar39);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 ^ auVar6,auVar39 ^ auVar6);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            (&pGVar2[6].is_dot)[lVar37] = false;
          }
          auVar39 = pshufhw(auVar39,auVar78,0x84);
          auVar17._4_4_ = iVar85;
          auVar17._0_4_ = iVar85;
          auVar17._8_4_ = iVar89;
          auVar17._12_4_ = iVar89;
          auVar72 = pshufhw(auVar62,auVar17,0x84);
          auVar68 = pshufhw(auVar39,auVar87,0x84);
          auVar42._8_4_ = 0xffffffff;
          auVar42._0_8_ = 0xffffffffffffffff;
          auVar42._12_4_ = 0xffffffff;
          auVar42 = (auVar68 | auVar72 & auVar39) ^ auVar42;
          auVar39 = packssdw(auVar42,auVar42);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39._6_2_ >> 8 & 1) != 0) {
            (&pGVar2[7].is_dot)[lVar37] = false;
          }
          auVar39 = auVar54 ^ auVar26;
          auVar63._0_4_ = -(uint)(iVar28 < auVar39._0_4_);
          auVar63._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
          auVar63._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
          auVar63._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
          auVar18._4_4_ = auVar63._0_4_;
          auVar18._0_4_ = auVar63._0_4_;
          auVar18._8_4_ = auVar63._8_4_;
          auVar18._12_4_ = auVar63._8_4_;
          auVar72 = pshuflw(auVar87,auVar18,0xe8);
          auVar43._0_4_ = -(uint)(auVar39._0_4_ == iVar28);
          auVar43._4_4_ = -(uint)(auVar39._4_4_ == iVar49);
          auVar43._8_4_ = -(uint)(auVar39._8_4_ == iVar70);
          auVar43._12_4_ = -(uint)(auVar39._12_4_ == iVar71);
          auVar79._4_4_ = auVar43._4_4_;
          auVar79._0_4_ = auVar43._4_4_;
          auVar79._8_4_ = auVar43._12_4_;
          auVar79._12_4_ = auVar43._12_4_;
          auVar39 = pshuflw(auVar43,auVar79,0xe8);
          auVar80._4_4_ = auVar63._4_4_;
          auVar80._0_4_ = auVar63._4_4_;
          auVar80._8_4_ = auVar63._12_4_;
          auVar80._12_4_ = auVar63._12_4_;
          auVar68 = pshuflw(auVar63,auVar80,0xe8);
          auVar64._8_4_ = 0xffffffff;
          auVar64._0_8_ = 0xffffffffffffffff;
          auVar64._12_4_ = 0xffffffff;
          auVar64 = (auVar68 | auVar39 & auVar72) ^ auVar64;
          auVar68 = packssdw(auVar64,auVar64);
          auVar39 = packsswb(auVar39 & auVar72,auVar68);
          if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (&pGVar2[8].is_dot)[lVar37] = false;
          }
          auVar19._4_4_ = auVar63._0_4_;
          auVar19._0_4_ = auVar63._0_4_;
          auVar19._8_4_ = auVar63._8_4_;
          auVar19._12_4_ = auVar63._8_4_;
          auVar80 = auVar79 & auVar19 | auVar80;
          auVar68 = packssdw(auVar80,auVar80);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar68 = packssdw(auVar68 ^ auVar7,auVar68 ^ auVar7);
          auVar39 = packsswb(auVar39,auVar68);
          if ((auVar39._8_2_ >> 8 & 1) != 0) {
            (&pGVar2[9].is_dot)[lVar37] = false;
          }
          auVar39 = auVar53 ^ auVar26;
          auVar65._0_4_ = -(uint)(iVar28 < auVar39._0_4_);
          auVar65._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
          auVar65._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
          auVar65._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
          auVar81._4_4_ = auVar65._0_4_;
          auVar81._0_4_ = auVar65._0_4_;
          auVar81._8_4_ = auVar65._8_4_;
          auVar81._12_4_ = auVar65._8_4_;
          iVar85 = -(uint)(auVar39._4_4_ == iVar49);
          iVar89 = -(uint)(auVar39._12_4_ == iVar71);
          auVar20._4_4_ = iVar85;
          auVar20._0_4_ = iVar85;
          auVar20._8_4_ = iVar89;
          auVar20._12_4_ = iVar89;
          auVar88._4_4_ = auVar65._4_4_;
          auVar88._0_4_ = auVar65._4_4_;
          auVar88._8_4_ = auVar65._12_4_;
          auVar88._12_4_ = auVar65._12_4_;
          auVar39 = auVar20 & auVar81 | auVar88;
          auVar39 = packssdw(auVar39,auVar39);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 ^ auVar8,auVar39 ^ auVar8);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            (&pGVar2[10].is_dot)[lVar37] = false;
          }
          auVar39 = pshufhw(auVar39,auVar81,0x84);
          auVar21._4_4_ = iVar85;
          auVar21._0_4_ = iVar85;
          auVar21._8_4_ = iVar89;
          auVar21._12_4_ = iVar89;
          auVar72 = pshufhw(auVar65,auVar21,0x84);
          auVar68 = pshufhw(auVar39,auVar88,0x84);
          auVar44._8_4_ = 0xffffffff;
          auVar44._0_8_ = 0xffffffffffffffff;
          auVar44._12_4_ = 0xffffffff;
          auVar44 = (auVar68 | auVar72 & auVar39) ^ auVar44;
          auVar39 = packssdw(auVar44,auVar44);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39._10_2_ >> 8 & 1) != 0) {
            (&pGVar2[0xb].is_dot)[lVar37] = false;
          }
          auVar39 = auVar52 ^ auVar26;
          auVar66._0_4_ = -(uint)(iVar28 < auVar39._0_4_);
          auVar66._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
          auVar66._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
          auVar66._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
          auVar22._4_4_ = auVar66._0_4_;
          auVar22._0_4_ = auVar66._0_4_;
          auVar22._8_4_ = auVar66._8_4_;
          auVar22._12_4_ = auVar66._8_4_;
          auVar72 = pshuflw(auVar88,auVar22,0xe8);
          auVar45._0_4_ = -(uint)(auVar39._0_4_ == iVar28);
          auVar45._4_4_ = -(uint)(auVar39._4_4_ == iVar49);
          auVar45._8_4_ = -(uint)(auVar39._8_4_ == iVar70);
          auVar45._12_4_ = -(uint)(auVar39._12_4_ == iVar71);
          auVar82._4_4_ = auVar45._4_4_;
          auVar82._0_4_ = auVar45._4_4_;
          auVar82._8_4_ = auVar45._12_4_;
          auVar82._12_4_ = auVar45._12_4_;
          auVar39 = pshuflw(auVar45,auVar82,0xe8);
          auVar83._4_4_ = auVar66._4_4_;
          auVar83._0_4_ = auVar66._4_4_;
          auVar83._8_4_ = auVar66._12_4_;
          auVar83._12_4_ = auVar66._12_4_;
          auVar68 = pshuflw(auVar66,auVar83,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 & auVar72,(auVar68 | auVar39 & auVar72) ^ auVar9);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            (&pGVar2[0xc].is_dot)[lVar37] = false;
          }
          auVar23._4_4_ = auVar66._0_4_;
          auVar23._0_4_ = auVar66._0_4_;
          auVar23._8_4_ = auVar66._8_4_;
          auVar23._12_4_ = auVar66._8_4_;
          auVar83 = auVar82 & auVar23 | auVar83;
          auVar68 = packssdw(auVar83,auVar83);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39,auVar68 ^ auVar10);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39._12_2_ >> 8 & 1) != 0) {
            (&pGVar2[0xd].is_dot)[lVar37] = false;
          }
          auVar39 = auVar50 ^ auVar26;
          auVar67._0_4_ = -(uint)(iVar28 < auVar39._0_4_);
          auVar67._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
          auVar67._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
          auVar67._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
          auVar84._4_4_ = auVar67._0_4_;
          auVar84._0_4_ = auVar67._0_4_;
          auVar84._8_4_ = auVar67._8_4_;
          auVar84._12_4_ = auVar67._8_4_;
          iVar28 = -(uint)(auVar39._4_4_ == iVar49);
          iVar49 = -(uint)(auVar39._12_4_ == iVar71);
          auVar69._4_4_ = iVar28;
          auVar69._0_4_ = iVar28;
          auVar69._8_4_ = iVar49;
          auVar69._12_4_ = iVar49;
          auVar46._4_4_ = auVar67._4_4_;
          auVar46._0_4_ = auVar67._4_4_;
          auVar46._8_4_ = auVar67._12_4_;
          auVar46._12_4_ = auVar67._12_4_;
          auVar46 = auVar69 & auVar84 | auVar46;
          auVar39 = packssdw(auVar46,auVar46);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 ^ auVar11,auVar39 ^ auVar11);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            (&pGVar2[0xe].is_dot)[lVar37] = false;
          }
          auVar39 = pshufhw(auVar39,auVar84,0x84);
          in_XMM11 = pshufhw(auVar67,auVar69,0x84);
          in_XMM11 = in_XMM11 & auVar39;
          auVar24._4_4_ = auVar67._4_4_;
          auVar24._0_4_ = auVar67._4_4_;
          auVar24._8_4_ = auVar67._12_4_;
          auVar24._12_4_ = auVar67._12_4_;
          auVar39 = pshufhw(auVar39,auVar24,0x84);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar47 = (auVar39 | in_XMM11) ^ auVar47;
          auVar39 = packssdw(auVar47,auVar47);
          auVar39 = packsswb(auVar39,auVar39);
          if ((auVar39._14_2_ >> 8 & 1) != 0) {
            (&pGVar2[0xf].is_dot)[lVar37] = false;
          }
          lVar36 = (long)DAT_00284a20;
          lVar51 = auVar58._8_8_;
          auVar58._0_8_ = auVar58._0_8_ + lVar36;
          lVar48 = DAT_00284a20._8_8_;
          auVar58._8_8_ = lVar51 + lVar48;
          lVar51 = auVar57._8_8_;
          auVar57._0_8_ = auVar57._0_8_ + lVar36;
          auVar57._8_8_ = lVar51 + lVar48;
          lVar51 = auVar56._8_8_;
          auVar56._0_8_ = auVar56._0_8_ + lVar36;
          auVar56._8_8_ = lVar51 + lVar48;
          lVar51 = auVar55._8_8_;
          auVar55._0_8_ = auVar55._0_8_ + lVar36;
          auVar55._8_8_ = lVar51 + lVar48;
          lVar51 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + lVar36;
          auVar54._8_8_ = lVar51 + lVar48;
          lVar51 = auVar53._8_8_;
          auVar53._0_8_ = auVar53._0_8_ + lVar36;
          auVar53._8_8_ = lVar51 + lVar48;
          lVar51 = auVar52._8_8_;
          auVar52._0_8_ = auVar52._0_8_ + lVar36;
          auVar52._8_8_ = lVar51 + lVar48;
          lVar51 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + lVar36;
          auVar50._8_8_ = lVar51 + lVar48;
          lVar37 = lVar37 + 0x300;
          auVar39 = _DAT_00284a20;
        } while ((ulong)(local_bc + 0xfU >> 4) * 0x300 != lVar37);
      }
    }
    else {
      pdVar32 = InputVector(s);
      if (0 < (long)local_bc) {
        pbVar38 = &pGVar2->is_dot;
        lVar37 = 0;
        do {
          *pbVar38 = pdVar32[lVar37] != 0.0;
          lVar37 = lVar37 + 1;
          pbVar38 = pbVar38 + 0x30;
        } while (local_bc != lVar37);
      }
      FreeVector(pdVar32);
    }
    ppdVar33 = InputMatrix(s);
    local_b8->invavgcov = ppdVar33;
    local_b8->trained = true;
  }
  else if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) == 0) {
    std::istream::putback(cVar25);
  }
  else {
    std::ios::clear((int)*(long *)(*(long *)s + -0x18) + (int)s);
  }
  pAVar27 = local_b0;
  if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) == 0) {
    pAVar30 = local_b0->data;
    if (pAVar30 != (Am_Gesture_Classifier_Data *)0x0) {
      puVar1 = &(pAVar30->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        (*(pAVar30->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
      }
    }
    pAVar27->data = local_b8;
    return s;
  }
LAB_001a3ad3:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"unrecognized gesture classifier format",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  std::ios::clear((int)*(undefined8 *)(*(long *)s + -0x18) + (int)s);
  return s;
}

Assistant:

std::istream &
operator>>(std::istream &s, Am_Gesture_Classifier &cl)
{
  int n;
  char buf[100];
  Am_Gesture_Classifier_Data *cldata = nullptr;
  Am_Gesture_Classifier_Data::Gesture_Class *classes;
  int ver;
  int i;
  char check;

  // First check gesture version

  s.get(buf, sizeof(buf), '\n');
  if (!s.get(check) || check != '\n')
    goto lFail;

  for (ver = 0;; ++ver)
    if (!version_messages[ver])
      goto lFail;
    else if (!strcmp(buf, version_messages[ver]))
      break;

  // Classifier and trainer formats both begin with a class list.  E.g.:
  //
  //   3 classes
  //   cut
  //   copy
  //   paste

  s >> n;
  s.get(buf, sizeof(buf), '\n');

  if (!s.get(check) || check != '\n' || strcmp(buf, " classes"))
    goto lFail;

  // construct a new classifier with n classes
  cldata = new Am_Gesture_Classifier_Data(n);
  classes = cldata->classes;

  //AM_TRACE(n << " classes " <<std::flush);
  for (i = 0; i < n; i++) {
    s.get(buf, sizeof(buf));
    if (!s.get(check) || check != '\n')
      // class name too long
      goto lFail;
    classes[i].name = buf;
    //AM_TRACE(buf << " " <<std::flush);
  }
  //AM_TRACE(endl);

  // Now look for weights, constants, covariance matrix.
  // Weight vector begins with 'V'.  If we don't find it, assume
  // we have an untrained classifier (i.e., just a list of classes).

  if (s >> check && check == 'V') {
    s.putback(check);

    for (i = 0; i < n; i++) {
      classes[i].average = InputVector(s);
      classes[i].w = InputVector(s);
    }

    Vector v = InputVector(s);
    for (i = 0; i < n; i++)
      classes[i].cnst = v[i];
    FreeVector(v);

    if (ver > NO_DOT_VERSION) {
      Vector v = InputVector(s);
      // read in is_dot fields for each class
      for (i = 0; i < n; ++i)
        classes[i].is_dot = (v[i] != 0.0);
      FreeVector(v);
    } else {
      // initialize all is_dot fields
      for (i = 0; i < n; ++i)
        classes[i].is_dot = false;
    }

    cldata->invavgcov = InputMatrix(s);

    cldata->trained = true;
  } else if (s)
    s.putback(check);
  else
    s.clear(std::ios::goodbit);

  if (!s)
    goto lFail;

  if (cl.data)
    cl.data->Release();
  cl.data = cldata;
  return s;

lFail:
  std::cerr << "unrecognized gesture classifier format" << std::endl;
  s.clear(std::ios::badbit);
  return s;
}